

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O2

bool __thiscall
cmFileTimeComparisonInternal::FileTimeCompare
          (cmFileTimeComparisonInternal *this,char *f1,char *f2,int *result)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  stat s2;
  stat s1;
  
  bVar1 = Stat(this,f1,&s1);
  uVar3 = 0;
  bVar2 = false;
  if (bVar1) {
    bVar1 = Stat(this,f2,&s2);
    uVar3 = 0;
    bVar2 = false;
    if (bVar1) {
      bVar2 = true;
      uVar3 = 0xffffffff;
      if (s2.st_mtim.tv_sec <= s1.st_mtim.tv_sec) {
        if (s2.st_mtim.tv_sec < s1.st_mtim.tv_sec) {
          uVar3 = 1;
        }
        else if (s2.st_mtim.tv_nsec <= s1.st_mtim.tv_nsec) {
          uVar3 = (uint)(s2.st_mtim.tv_nsec < s1.st_mtim.tv_nsec);
        }
      }
    }
  }
  *result = uVar3;
  return bVar2;
}

Assistant:

bool cmFileTimeComparisonInternal::FileTimeCompare(const char* f1,
                                                   const char* f2, int* result)
{
  // Get the modification time for each file.
  cmFileTimeComparison_Type s1;
  cmFileTimeComparison_Type s2;
  if (this->Stat(f1, &s1) && this->Stat(f2, &s2)) {
    // Compare the two modification times.
    *result = this->Compare(&s1, &s2);
    return true;
  }
  // No comparison available.  Default to the same time.
  *result = 0;
  return false;
}